

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_StartConversation
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  AActor *this;
  
  if (arg0 != 0) {
    for (this = AActor::TIDHash[arg0 & 0x7f]; this != (AActor *)0x0; this = this->inext) {
      if (this->tid == arg0) {
        if (it == (AActor *)0x0) {
          return 0;
        }
        if (it->player == (player_t *)0x0) {
          return 0;
        }
        if (it->player->mo != (APlayerPawn *)it) {
          return 0;
        }
        if (it->health < 1) {
          return 0;
        }
        if (this->health < 1) {
          return 0;
        }
        if (((this->flags4).Value & 0x8000) != 0) {
          return 0;
        }
        if (this->Conversation == (FStrifeDialogueNode *)0x0) {
          return 0;
        }
        AActor::ConversationAnimation(this,0);
        P_StartConversation(this,it,arg1 != 0,true);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

FUNC(LS_StartConversation)
// StartConversation (tid, facetalker)
{
	FActorIterator iterator (arg0);

	AActor *target = iterator.Next();

	// Nothing to talk to
	if (target == NULL)
	{
		return false;
	}
	
	// Only living players are allowed to start conversations
	if (it == NULL || it->player == NULL || it->player->mo != it || it->health<=0)
	{
		return false;
	}

	// Dead things can't talk.
	if (target->health <= 0)
	{
		return false;
	}
	// Fighting things don't talk either.
	if (target->flags4 & MF4_INCOMBAT)
	{
		return false;
	}
	if (target->Conversation != NULL)
	{
		// Give the NPC a chance to play a brief animation
		target->ConversationAnimation (0);
		P_StartConversation (target, it, !!arg1, true);
		return true;
	}
	return false;
}